

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_date<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  local_date lVar1;
  value_type *pvVar2;
  error_type *this;
  error_info *v;
  basic_value<toml::type_config> *pbVar3;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  val_fmt_reg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  undefined1 local_350 [48];
  size_t local_320;
  size_t sStack_318;
  size_t local_310;
  size_t sStack_308;
  size_t local_300;
  size_t sStack_2f8;
  size_t local_2f0;
  undefined1 local_2e8 [48];
  size_t local_2b8;
  size_t sStack_2b0;
  size_t local_2a8;
  size_t sStack_2a0;
  size_t local_298;
  size_t sStack_290;
  size_t local_288;
  undefined1 local_280 [120];
  undefined1 local_208 [120];
  size_t local_190;
  size_t sStack_188;
  size_t local_180;
  size_t sStack_178;
  size_t local_170;
  size_t sStack_168;
  size_t local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  basic_value<toml::type_config> local_140;
  failure<toml::error_info> local_78;
  
  parse_local_date_only<toml::type_config>
            ((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
              *)local_280,loc,ctx);
  if (local_280[0] == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                         *)local_280,(source_location)0x556338);
    err<toml::error_info&>(&local_78,(toml *)this,v);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_78);
    failure<toml::error_info>::~failure(&local_78);
  }
  else {
    pvVar2 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                       *)local_280,(source_location)0x556350);
    lVar1 = (pvVar2->
            super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
            ).super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
              *)local_280,(source_location)0x556368);
    pvVar2 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                       *)local_280,(source_location)0x556380);
    local_208._72_8_ =
         (pvVar2->
         super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
         ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
         super__Tuple_impl<2UL,_toml::detail::region>.
         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_208._80_8_ =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(pvVar2->
                 super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         + 8))->_M_pi;
    (pvVar2->
    super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = 0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(pvVar2->
            super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
            super__Tuple_impl<2UL,_toml::detail::region>.
            super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    + 8))->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2e8._16_8_ = local_2e8 + 0x20;
    local_208._88_8_ =
         (pvVar2->
         super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
         ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
         super__Tuple_impl<2UL,_toml::detail::region>.
         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_._M_dataplus.
         _M_p;
    pbVar3 = (basic_value<toml::type_config> *)
             &(pvVar2->
              super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
              ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
              super__Tuple_impl<2UL,_toml::detail::region>.
              super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2;
    if ((basic_value<toml::type_config> *)local_208._88_8_ == pbVar3) {
      local_2e8._32_8_ = *(undefined8 *)pbVar3;
      local_2e8._40_8_ =
           *(undefined8 *)
            ((long)&(pvVar2->
                    super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                    ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                    super__Tuple_impl<2UL,_toml::detail::region>.
                    super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                    field_2 + 8);
      local_208._88_8_ = local_2e8._16_8_;
    }
    else {
      local_2e8._32_8_ = *(undefined8 *)pbVar3;
    }
    local_208._104_8_ = local_2e8._32_8_;
    local_208._96_8_ =
         (pvVar2->
         super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
         ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
         super__Tuple_impl<2UL,_toml::detail::region>.
         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
         _M_string_length;
    (pvVar2->
    super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_._M_dataplus._M_p = (pointer)pbVar3;
    (pvVar2->
    super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_._M_string_length = 0;
    (pvVar2->
    super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>).
    super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_.field_2._M_local_buf[0] = '\0';
    local_2f0 = (pvVar2->
                super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_column_;
    local_300 = (pvVar2->
                super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_;
    sStack_2f8 = (pvVar2->
                 super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_line_;
    local_310 = (pvVar2->
                super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_line_;
    sStack_308 = (pvVar2->
                 super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_column_;
    local_320 = (pvVar2->
                super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.length_;
    sStack_318 = (pvVar2->
                 super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                 ).super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_;
    local_2e8._0_8_ = (element_type *)0x0;
    local_2e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_350._16_8_ = local_350 + 0x20;
    if (local_208._88_8_ == local_2e8._16_8_) {
      local_350._40_8_ = local_2e8._40_8_;
      local_208._88_8_ = local_350._16_8_;
    }
    local_2e8._24_8_ = 0;
    local_2e8._32_8_ = local_2e8._32_8_ & 0xffffffffffffff00;
    local_208[0] = (toml)0x7;
    local_350._0_8_ = (element_type *)0x0;
    local_350._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pbVar3 = (basic_value<toml::type_config> *)local_208._104_8_;
    if (local_208._88_8_ == local_350._16_8_) {
      local_208._112_8_ = local_350._40_8_;
      pbVar3 = (basic_value<toml::type_config> *)local_208._88_8_;
      local_208._88_8_ = (basic_value<toml::type_config> *)(local_208 + 0x68);
    }
    local_350._24_8_ = 0;
    local_350._32_8_ = local_208._104_8_ & 0xffffffffffffff00;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b8 = local_320;
    sStack_2b0 = sStack_318;
    local_2a8 = local_310;
    sStack_2a0 = sStack_308;
    local_298 = local_300;
    sStack_290 = sStack_2f8;
    local_288 = local_2f0;
    local_208._8_4_ = lVar1;
    local_190 = local_320;
    sStack_188 = sStack_318;
    local_180 = local_310;
    sStack_178 = sStack_308;
    local_170 = local_300;
    sStack_168 = sStack_2f8;
    local_160 = local_2f0;
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_140,(toml *)local_208,pbVar3
              );
    __return_storage_ptr__->is_ok_ = true;
    pbVar3 = &local_140;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,pbVar3);
    basic_value<toml::type_config>::cleanup(&local_140,(EVP_PKEY_CTX *)pbVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_140.comments_.comments);
    region::~region(&local_140.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_208,(EVP_PKEY_CTX *)pbVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158);
    region::~region((region *)(local_208 + 0x48));
    region::~region((region *)local_350);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
    region::~region((region *)local_2e8);
  }
  if (local_280[0] == true) {
    region::~region((region *)(local_280 + 8));
  }
  else {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_280 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_date(location& loc, const context<TC>& ctx)
{
    auto val_fmt_reg = parse_local_date_only(loc, ctx);
    if(val_fmt_reg.is_err())
    {
        return err(val_fmt_reg.unwrap_err());
    }

    auto val = std::move(std::get<0>(val_fmt_reg.unwrap()));
    auto fmt = std::move(std::get<1>(val_fmt_reg.unwrap()));
    auto reg = std::move(std::get<2>(val_fmt_reg.unwrap()));

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}